

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::debugging_internal::ParseTemplateTemplateParam(State *state)

{
  bool bVar1;
  State *in_RDI;
  State *in_stack_00000008;
  bool in_stack_00000017;
  State *in_stack_00000018;
  ComplexityGuard guard;
  bool local_2e;
  ComplexityGuard local_18 [2];
  bool local_1;
  
  anon_unknown_3::ComplexityGuard::ComplexityGuard(local_18,in_RDI);
  bVar1 = anon_unknown_3::ComplexityGuard::IsTooComplex(local_18);
  if (bVar1) {
    local_1 = false;
  }
  else {
    bVar1 = ParseTemplateParam(in_stack_00000008);
    local_2e = true;
    if (!bVar1) {
      local_2e = ParseSubstitution(in_stack_00000018,in_stack_00000017);
    }
    local_1 = local_2e;
  }
  anon_unknown_3::ComplexityGuard::~ComplexityGuard(local_18);
  return (bool)(local_1 & 1);
}

Assistant:

static bool ParseTemplateTemplateParam(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  return (ParseTemplateParam(state) ||
          // "std" on its own isn't a template.
          ParseSubstitution(state, /*accept_std=*/false));
}